

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O0

int32_t __thiscall icu_63::RBBISetBuilder::getTrieSize(RBBISetBuilder *this)

{
  UBool UVar1;
  uint32_t uVar2;
  RBBISetBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*this->fStatus);
  if (UVar1 == '\0') {
    utrie2_freeze_63(this->fTrie,UTRIE2_16_VALUE_BITS,this->fStatus);
    uVar2 = utrie2_serialize_63(this->fTrie,(void *)0x0,0,this->fStatus);
    this->fTrieSize = uVar2;
    if (*this->fStatus == U_BUFFER_OVERFLOW_ERROR) {
      *this->fStatus = U_ZERO_ERROR;
    }
    this_local._4_4_ = this->fTrieSize;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t RBBISetBuilder::getTrieSize()  {
    if (U_FAILURE(*fStatus)) {
        return 0;
    }
    utrie2_freeze(fTrie, UTRIE2_16_VALUE_BITS, fStatus);
    fTrieSize  = utrie2_serialize(fTrie,
                                  NULL,                // Buffer
                                  0,                   // Capacity
                                  fStatus);
    if (*fStatus == U_BUFFER_OVERFLOW_ERROR) {
        *fStatus = U_ZERO_ERROR;
    }
    // RBBIDebugPrintf("Trie table size is %d\n", trieSize);
    return fTrieSize;
}